

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O3

void __thiscall FStringTable::LoadStrings(FStringTable *this,bool enuOnly)

{
  uint in_EAX;
  int lumpnum;
  ulong uVar1;
  undefined7 in_register_00000031;
  long lVar2;
  int iVar3;
  int lastlump;
  undefined8 local_38;
  
  uVar1 = CONCAT71(in_register_00000031,enuOnly) & 0xffffffff;
  local_38._0_4_ = in_EAX;
  FreeNonDehackedStrings(this);
  local_38 = (ulong)(uint)local_38;
  lumpnum = FWadCollection::FindLump(&Wads,"LANGUAGE",(int *)((long)&local_38 + 4),false);
  if (lumpnum != -1) {
    local_38 = CONCAT44(local_38._4_4_,(int)CONCAT71(in_register_00000031,enuOnly));
    do {
      iVar3 = 1;
      if ((char)uVar1 == '\0') {
        LoadLanguage(this,lumpnum,0x2a,true,1);
        iVar3 = 2;
        lVar2 = 0;
        do {
          LoadLanguage(this,lumpnum,LanguageIDs[lVar2],true,iVar3);
          LoadLanguage(this,lumpnum,(uint)(ushort)LanguageIDs[lVar2],true,iVar3 + 1);
          LoadLanguage(this,lumpnum,LanguageIDs[lVar2],false,iVar3 + 2);
          lVar2 = lVar2 + 1;
          iVar3 = iVar3 + 3;
        } while (lVar2 != 4);
        iVar3 = 0xe;
        uVar1 = local_38 & 0xffffffff;
      }
      LoadLanguage(this,lumpnum,0x2a2a,true,iVar3);
      lumpnum = FWadCollection::FindLump(&Wads,"LANGUAGE",(int *)((long)&local_38 + 4),false);
    } while (lumpnum != -1);
  }
  return;
}

Assistant:

void FStringTable::LoadStrings (bool enuOnly)
{
	int lastlump, lump;
	int i, j;

	FreeNonDehackedStrings ();

	lastlump = 0;

	while ((lump = Wads.FindLump ("LANGUAGE", &lastlump)) != -1)
	{
		j = 0;
		if (!enuOnly)
		{
			LoadLanguage (lump, MAKE_ID('*',0,0,0), true, ++j);
			for (i = 0; i < 4; ++i)
			{
				LoadLanguage (lump, LanguageIDs[i], true, ++j);
				LoadLanguage (lump, LanguageIDs[i] & MAKE_ID(0xff,0xff,0,0), true, ++j);
				LoadLanguage (lump, LanguageIDs[i], false, ++j);
			}
		}

		// Fill in any missing strings with the default language
		LoadLanguage (lump, MAKE_ID('*','*',0,0), true, ++j);
	}
}